

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderIndexingTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalSubscriptMat4x3(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_a0;
  undefined1 local_88 [12];
  Vector<float,_3> local_7c;
  undefined1 local_70 [12];
  Vector<float,_3> local_64;
  undefined1 local_58 [12];
  Vector<float,_3> local_4c;
  undefined1 local_40 [12];
  Vector<float,_3> local_34;
  Vector<float,_3> local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)c,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_58,(int)local_10,1,2);
  tcu::operator*((tcu *)&local_4c,0.5,(Vector<float,_3> *)local_58);
  tcu::operator+((tcu *)&local_34,(Vector<float,_3> *)local_40,&local_4c);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_70,(int)local_10,2,3);
  tcu::operator*((tcu *)&local_64,0.25,(Vector<float,_3> *)local_70);
  tcu::operator+((tcu *)&local_28,&local_34,&local_64);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_88,(int)local_10,3,0);
  tcu::operator*((tcu *)&local_7c,0.125,(Vector<float,_3> *)local_88);
  tcu::operator+((tcu *)&local_1c,&local_28,&local_7c);
  tcu::Vector<float,_4>::xyz(&local_a0,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_a0,&local_1c);
  return;
}

Assistant:

void evalSubscriptMat4x3	(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3) + 0.25f*c.coords.swizzle(2,3,0) + 0.125f*c.coords.swizzle(3,0,1); }